

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O3

LY_ERR lyd_new_implicit_tree(lyd_node *tree,uint32_t implicit_options,lyd_node **diff)

{
  lyd_node_inner *plVar1;
  LY_ERR LVar2;
  lyd_node **first;
  lysc_node *plVar3;
  lyd_node_inner *plVar4;
  lyd_node *node;
  ly_ht *getnext_ht;
  lyd_node *tree_local;
  ly_set node_when;
  
  node_when.size = 0;
  node_when.count = 0;
  node_when.field_2.dnodes = (lyd_node **)0x0;
  getnext_ht = (ly_ht *)0x0;
  tree_local = tree;
  if (tree == (lyd_node *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","tree",
           "lyd_new_implicit_tree");
    return LY_EINVAL;
  }
  if (diff != (lyd_node **)0x0) {
    *diff = (lyd_node *)0x0;
  }
  LVar2 = lyd_val_getnext_ht_new(&getnext_ht);
  if (LVar2 == LY_SUCCESS) {
LAB_0012f6e3:
    node = tree;
    plVar3 = node->schema;
    if (plVar3 == (lysc_node *)0x0) goto LAB_0012f740;
    if ((plVar3->nodetype & 0x711) != 0) {
      first = lyd_node_child_p(node);
      LVar2 = lyd_new_implicit(node,first,(lysc_node *)0x0,(lys_module *)0x0,&node_when,
                               (ly_set *)0x0,(ly_set *)0x0,implicit_options,getnext_ht,diff);
      if (LVar2 != LY_SUCCESS) goto LAB_0012f7f0;
      plVar3 = node->schema;
      if (plVar3 == (lysc_node *)0x0) goto LAB_0012f740;
    }
    if ((plVar3->nodetype & 0x711) != 0) goto LAB_0012f740;
    goto LAB_0012f74a;
  }
LAB_0012f7f0:
  ly_set_erase(&node_when,(_func_void_void_ptr *)0x0);
  lyd_val_getnext_ht_free(getnext_ht);
  if ((diff != (lyd_node **)0x0) && (LVar2 != LY_SUCCESS)) {
    lyd_free_all(*diff);
    *diff = (lyd_node *)0x0;
  }
  return LVar2;
LAB_0012f740:
  tree = *(lyd_node **)(node + 1);
  if (*(lyd_node **)(node + 1) == (lyd_node *)0x0) {
LAB_0012f74a:
    if (node == tree_local) goto LAB_0012f7af;
    tree = node->next;
    if (node->next == (lyd_node *)0x0) {
      plVar4 = node->parent;
      do {
        plVar1 = (plVar4->field_0).node.parent;
        if (plVar1 == tree_local->parent) goto LAB_0012f7af;
        tree = (plVar4->field_0).node.next;
        plVar4 = plVar1;
      } while (tree == (lyd_node *)0x0);
    }
  }
  goto LAB_0012f6e3;
LAB_0012f7af:
  LVar2 = lyd_validate_unres(&tree_local,(lys_module *)0x0,LYD_TYPE_DATA_YANG,&node_when,1,
                             (ly_set *)0x0,(ly_set *)0x0,(ly_set *)0x0,(ly_set *)0x0,0,diff);
  goto LAB_0012f7f0;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_new_implicit_tree(struct lyd_node *tree, uint32_t implicit_options, struct lyd_node **diff)
{
    LY_ERR rc = LY_SUCCESS;
    struct lyd_node *node;
    struct ly_set node_when = {0};
    struct ly_ht *getnext_ht = NULL;

    LY_CHECK_ARG_RET(NULL, tree, LY_EINVAL);
    if (diff) {
        *diff = NULL;
    }

    /* create the getnext hash table */
    LY_CHECK_GOTO(rc = lyd_val_getnext_ht_new(&getnext_ht), cleanup);

    LYD_TREE_DFS_BEGIN(tree, node) {
        if (node->schema && (node->schema->nodetype & LYD_NODE_INNER)) {
            LY_CHECK_GOTO(rc = lyd_new_implicit(node, lyd_node_child_p(node), NULL, NULL, &node_when, NULL,
                    NULL, implicit_options, getnext_ht, diff), cleanup);
        }

        LYD_TREE_DFS_END(tree, node);
    }

    /* resolve when and remove any invalid defaults */
    rc = lyd_validate_unres(&tree, NULL, 0, &node_when, LYXP_IGNORE_WHEN, NULL, NULL, NULL, NULL, 0, diff);
    LY_CHECK_GOTO(rc, cleanup);

cleanup:
    ly_set_erase(&node_when, NULL);
    lyd_val_getnext_ht_free(getnext_ht);
    if (rc && diff) {
        lyd_free_all(*diff);
        *diff = NULL;
    }
    return rc;
}